

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void P_CollectACSGlobalStrings(void)

{
  FACSStack *strnum;
  FACSStack **ppFVar1;
  
  ppFVar1 = &FACSStack::head;
  while (strnum = *ppFVar1, strnum != (FACSStack *)0x0) {
    ACSStringPool::MarkStringArray(&GlobalACSStrings,strnum->buffer,strnum->sp);
    ppFVar1 = &strnum->next;
  }
  FBehavior::StaticMarkLevelVarStrings();
  P_MarkWorldVarStrings();
  P_MarkGlobalVarStrings();
  ACSStringPool::PurgeStrings(&GlobalACSStrings);
  return;
}

Assistant:

void P_CollectACSGlobalStrings()
{
	for (FACSStack *stack = FACSStack::head; stack != NULL; stack = stack->next)
	{
		GlobalACSStrings.MarkStringArray(stack->buffer, stack->sp);
	}
	FBehavior::StaticMarkLevelVarStrings();
	P_MarkWorldVarStrings();
	P_MarkGlobalVarStrings();
	GlobalACSStrings.PurgeStrings();
}